

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeBuilder.cpp
# Opt level: O0

void __thiscall
OctreeBuilder::CmdBuild(OctreeBuilder *this,shared_ptr<myvk::CommandBuffer> *command_buffer)

{
  initializer_list<VkBufferCopy> __l;
  initializer_list<VkBufferCopy> __l_00;
  initializer_list<VkBufferMemoryBarrier> __l_01;
  initializer_list<VkBufferMemoryBarrier> __l_02;
  initializer_list<std::shared_ptr<myvk::DescriptorSet>_> __l_03;
  initializer_list<VkBufferMemoryBarrier> __l_04;
  initializer_list<VkBufferMemoryBarrier> __l_05;
  initializer_list<VkBufferMemoryBarrier> __l_06;
  initializer_list<VkBufferMemoryBarrier> __l_07;
  initializer_list<VkBufferMemoryBarrier> __l_08;
  uint uVar1;
  uint32_t uVar2;
  element_type *peVar3;
  element_type *peVar4;
  uint32_t i;
  uint32_t fragment_group_x;
  uint32_t in_stack_fffffffffffff828;
  VkPipelineBindPoint in_stack_fffffffffffff82c;
  CommandBuffer *in_stack_fffffffffffff830;
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  *in_stack_fffffffffffff838;
  uint32_t in_stack_fffffffffffff840;
  uint32_t in_stack_fffffffffffff844;
  vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *in_stack_fffffffffffff848;
  BufferBase *in_stack_fffffffffffff850;
  element_type *in_stack_fffffffffffff858;
  CommandBuffer *in_stack_fffffffffffff860;
  iterator in_stack_fffffffffffff868;
  element_type *in_stack_fffffffffffff870;
  element_type *in_stack_fffffffffffff878;
  vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *in_stack_fffffffffffff880;
  pointer *in_stack_fffffffffffff888;
  CommandBuffer *in_stack_fffffffffffff890;
  undefined8 ****local_6c0;
  vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> local_608;
  BufferBase local_5e9;
  undefined1 *local_5b0;
  undefined8 local_5a8;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined1 local_568 [31];
  VkBufferMemoryBarrier local_549;
  byte *local_510;
  undefined8 local_508;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> local_4c8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  CommandBuffer local_499;
  undefined1 *local_460;
  undefined8 local_458;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  allocator<VkBufferMemoryBarrier> local_3d9;
  undefined1 local_3d8 [56];
  undefined1 *local_3a0;
  undefined8 local_398;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  allocator<VkBufferMemoryBarrier> local_329;
  undefined1 local_328 [56];
  undefined1 *local_2f0;
  undefined8 local_2e8;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  uint local_28c;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  allocator<std::shared_ptr<myvk::DescriptorSet>_> local_269;
  undefined8 ***local_268 [2];
  undefined1 ****local_258;
  undefined8 local_250;
  uint32_t local_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  allocator<VkBufferMemoryBarrier> local_209;
  undefined1 local_208 [56];
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  allocator<VkBufferMemoryBarrier> local_169;
  undefined1 local_168 [56];
  undefined1 *local_130;
  undefined8 local_128;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  allocator<VkBufferCopy> local_e1;
  undefined8 local_e0;
  undefined8 local_d8;
  VkDeviceSize local_d0;
  undefined8 *local_c8;
  undefined8 local_c0;
  allocator<VkBufferCopy> local_7d [13];
  undefined8 local_70;
  undefined8 local_68;
  VkDeviceSize local_60;
  undefined8 *local_58;
  undefined8 local_50;
  
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1569c4);
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            ((shared_ptr<myvk::BufferBase> *)in_stack_fffffffffffff830,
             (shared_ptr<myvk::Buffer> *)
             CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            ((shared_ptr<myvk::BufferBase> *)in_stack_fffffffffffff830,
             (shared_ptr<myvk::Buffer> *)
             CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
  local_70 = 0;
  local_68 = 0;
  peVar3 = std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x156a41);
  local_60 = myvk::BufferBase::GetSize(&peVar3->super_BufferBase);
  local_58 = &local_70;
  local_50 = 1;
  std::allocator<VkBufferCopy>::allocator((allocator<VkBufferCopy> *)0x156a97);
  __l._M_len = (size_type)in_stack_fffffffffffff870;
  __l._M_array = (iterator)in_stack_fffffffffffff868;
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::vector
            ((vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)in_stack_fffffffffffff860,__l,
             (allocator_type *)in_stack_fffffffffffff858);
  myvk::CommandBuffer::CmdCopy
            (in_stack_fffffffffffff860,(Ptr<BufferBase> *)in_stack_fffffffffffff858,
             (Ptr<BufferBase> *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::~vector
            ((vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)
             CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  std::allocator<VkBufferCopy>::~allocator(local_7d);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x156b0c);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x156b19);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x156b26);
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            ((shared_ptr<myvk::BufferBase> *)in_stack_fffffffffffff830,
             (shared_ptr<myvk::Buffer> *)
             CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            ((shared_ptr<myvk::BufferBase> *)in_stack_fffffffffffff830,
             (shared_ptr<myvk::Buffer> *)
             CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
  local_e0 = 0;
  local_d8 = 0;
  peVar3 = std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x156ba3);
  local_d0 = myvk::BufferBase::GetSize(&peVar3->super_BufferBase);
  local_c8 = &local_e0;
  local_c0 = 1;
  std::allocator<VkBufferCopy>::allocator((allocator<VkBufferCopy> *)0x156bf9);
  __l_00._M_len = (size_type)in_stack_fffffffffffff870;
  __l_00._M_array = (iterator)in_stack_fffffffffffff868;
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::vector
            ((vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)in_stack_fffffffffffff860,__l_00
             ,(allocator_type *)in_stack_fffffffffffff858);
  myvk::CommandBuffer::CmdCopy
            (in_stack_fffffffffffff860,(Ptr<BufferBase> *)in_stack_fffffffffffff858,
             (Ptr<BufferBase> *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::~vector
            ((vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)
             CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  std::allocator<VkBufferCopy>::~allocator(&local_e1);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x156c6e);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x156c7b);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x156c88);
  local_108 = 0;
  uStack_100 = 0;
  local_f8 = 0;
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x156cb4);
  std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x156cc8
            );
  myvk::BufferBase::GetMemoryBarrier
            (in_stack_fffffffffffff850,(VkAccessFlags)((ulong)in_stack_fffffffffffff848 >> 0x20),
             (VkAccessFlags)in_stack_fffffffffffff848,in_stack_fffffffffffff844,
             in_stack_fffffffffffff840);
  local_130 = local_168;
  local_128 = 1;
  std::allocator<VkBufferMemoryBarrier>::allocator((allocator<VkBufferMemoryBarrier> *)0x156d1e);
  __l_01._M_len = (size_type)in_stack_fffffffffffff870;
  __l_01._M_array = in_stack_fffffffffffff868;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
             in_stack_fffffffffffff860,__l_01,(allocator_type *)in_stack_fffffffffffff858);
  local_188 = 0;
  uStack_180 = 0;
  local_178 = 0;
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)0x156d71);
  myvk::CommandBuffer::CmdPipelineBarrier
            (in_stack_fffffffffffff890,
             (VkPipelineStageFlags)((ulong)in_stack_fffffffffffff888 >> 0x20),
             (VkPipelineStageFlags)in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
             in_stack_fffffffffffff878,
             (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             in_stack_fffffffffffff870);
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
             CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  std::allocator<VkBufferMemoryBarrier>::~allocator(&local_169);
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)
             CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x156de3);
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_198 = 0;
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x156e0f);
  std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x156e23
            );
  myvk::BufferBase::GetMemoryBarrier
            (in_stack_fffffffffffff850,(VkAccessFlags)((ulong)in_stack_fffffffffffff848 >> 0x20),
             (VkAccessFlags)in_stack_fffffffffffff848,in_stack_fffffffffffff844,
             in_stack_fffffffffffff840);
  local_1d0 = local_208;
  local_1c8 = 1;
  std::allocator<VkBufferMemoryBarrier>::allocator((allocator<VkBufferMemoryBarrier> *)0x156e79);
  __l_02._M_len = (size_type)in_stack_fffffffffffff870;
  __l_02._M_array = in_stack_fffffffffffff868;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
             in_stack_fffffffffffff860,__l_02,(allocator_type *)in_stack_fffffffffffff858);
  local_228 = 0;
  uStack_220 = 0;
  local_218 = 0;
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)0x156ecc);
  myvk::CommandBuffer::CmdPipelineBarrier
            (in_stack_fffffffffffff890,
             (VkPipelineStageFlags)((ulong)in_stack_fffffffffffff888 >> 0x20),
             (VkPipelineStageFlags)in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
             in_stack_fffffffffffff878,
             (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             in_stack_fffffffffffff870);
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
             CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  std::allocator<VkBufferMemoryBarrier>::~allocator(&local_209);
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)
             CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  peVar4 = std::__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x156f3e);
  uVar2 = Voxelizer::GetVoxelFragmentCount(peVar4);
  local_22c = group_x_64(uVar2);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x156f61);
  std::shared_ptr<myvk::DescriptorSet>::shared_ptr
            ((shared_ptr<myvk::DescriptorSet> *)in_stack_fffffffffffff830,
             (shared_ptr<myvk::DescriptorSet> *)
             CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
  local_250 = 1;
  local_258 = (undefined1 ****)local_268;
  std::allocator<std::shared_ptr<myvk::DescriptorSet>_>::allocator
            ((allocator<std::shared_ptr<myvk::DescriptorSet>_> *)0x156fbe);
  __l_03._M_len = (size_type)in_stack_fffffffffffff870;
  __l_03._M_array = (iterator)in_stack_fffffffffffff868;
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
            *)in_stack_fffffffffffff860,__l_03,(allocator_type *)in_stack_fffffffffffff858);
  local_288 = 0;
  uStack_280 = 0;
  local_278 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x157025);
  myvk::CommandBuffer::CmdBindDescriptorSets
            ((CommandBuffer *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
             in_stack_fffffffffffff838,(Ptr<PipelineLayout> *)in_stack_fffffffffffff830,
             in_stack_fffffffffffff82c,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x15704f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
             *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  std::allocator<std::shared_ptr<myvk::DescriptorSet>_>::~allocator(&local_269);
  local_6c0 = &local_258;
  do {
    local_6c0 = local_6c0 + -2;
    std::shared_ptr<myvk::DescriptorSet>::~shared_ptr((shared_ptr<myvk::DescriptorSet> *)0x1570ad);
  } while (local_6c0 != local_268);
  local_28c = 1;
  while( true ) {
    uVar1 = local_28c;
    peVar4 = std::__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x1570f0);
    uVar2 = Voxelizer::GetLevel(peVar4);
    if (uVar2 < uVar1) break;
    std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x157116);
    std::shared_ptr<myvk::PipelineBase>::shared_ptr<myvk::ComputePipeline,void>
              ((shared_ptr<myvk::PipelineBase> *)in_stack_fffffffffffff830,
               (shared_ptr<myvk::ComputePipeline> *)
               CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
    myvk::CommandBuffer::CmdBindPipeline
              ((CommandBuffer *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
               (Ptr<PipelineBase> *)in_stack_fffffffffffff838);
    std::shared_ptr<myvk::PipelineBase>::~shared_ptr((shared_ptr<myvk::PipelineBase> *)0x157163);
    std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x157170);
    std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
              ((shared_ptr<myvk::BufferBase> *)in_stack_fffffffffffff830,
               (shared_ptr<myvk::Buffer> *)
               CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
    myvk::CommandBuffer::CmdDispatchIndirect
              ((CommandBuffer *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
               (Ptr<BufferBase> *)in_stack_fffffffffffff838,(VkDeviceSize)in_stack_fffffffffffff830)
    ;
    std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x1571c4);
    std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x1571d1);
    local_2c8 = 0;
    uStack_2c0 = 0;
    local_2b8 = 0;
    std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
              ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x1571fd);
    std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x157211);
    myvk::BufferBase::GetMemoryBarrier
              (in_stack_fffffffffffff850,(VkAccessFlags)((ulong)in_stack_fffffffffffff848 >> 0x20),
               (VkAccessFlags)in_stack_fffffffffffff848,in_stack_fffffffffffff844,
               in_stack_fffffffffffff840);
    local_2f0 = local_328;
    local_2e8 = 1;
    std::allocator<VkBufferMemoryBarrier>::allocator((allocator<VkBufferMemoryBarrier> *)0x157267);
    __l_04._M_len = (size_type)in_stack_fffffffffffff870;
    __l_04._M_array = in_stack_fffffffffffff868;
    std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
              ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
               in_stack_fffffffffffff860,__l_04,(allocator_type *)in_stack_fffffffffffff858);
    local_348 = 0;
    uStack_340 = 0;
    local_338 = 0;
    std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
              ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)0x1572ba);
    myvk::CommandBuffer::CmdPipelineBarrier
              (in_stack_fffffffffffff890,
               (VkPipelineStageFlags)((ulong)in_stack_fffffffffffff888 >> 0x20),
               (VkPipelineStageFlags)in_stack_fffffffffffff888,in_stack_fffffffffffff880,
               (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
               in_stack_fffffffffffff878,
               (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
               in_stack_fffffffffffff870);
    std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
              ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
    std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
              ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
    std::allocator<VkBufferMemoryBarrier>::~allocator(&local_329);
    std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
              ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)
               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
    std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x157329);
    std::shared_ptr<myvk::PipelineBase>::shared_ptr<myvk::ComputePipeline,void>
              ((shared_ptr<myvk::PipelineBase> *)in_stack_fffffffffffff830,
               (shared_ptr<myvk::ComputePipeline> *)
               CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
    myvk::CommandBuffer::CmdBindPipeline
              ((CommandBuffer *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
               (Ptr<PipelineBase> *)in_stack_fffffffffffff838);
    std::shared_ptr<myvk::PipelineBase>::~shared_ptr((shared_ptr<myvk::PipelineBase> *)0x157376);
    std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x157383);
    myvk::CommandBuffer::CmdDispatch
              (in_stack_fffffffffffff830,in_stack_fffffffffffff82c,in_stack_fffffffffffff828,0);
    uVar1 = local_28c;
    peVar4 = std::__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x1573b4);
    uVar2 = Voxelizer::GetLevel(peVar4);
    if (uVar1 != uVar2) {
      std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1573da);
      local_378 = 0;
      uStack_370 = 0;
      local_368 = 0;
      std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
                ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x157406);
      std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x15741a);
      myvk::BufferBase::GetMemoryBarrier
                (in_stack_fffffffffffff850,(VkAccessFlags)((ulong)in_stack_fffffffffffff848 >> 0x20)
                 ,(VkAccessFlags)in_stack_fffffffffffff848,in_stack_fffffffffffff844,
                 in_stack_fffffffffffff840);
      local_3a0 = local_3d8;
      local_398 = 1;
      std::allocator<VkBufferMemoryBarrier>::allocator((allocator<VkBufferMemoryBarrier> *)0x157470)
      ;
      __l_05._M_len = (size_type)in_stack_fffffffffffff870;
      __l_05._M_array = in_stack_fffffffffffff868;
      std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
                ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                 in_stack_fffffffffffff860,__l_05,(allocator_type *)in_stack_fffffffffffff858);
      local_3f8 = 0;
      uStack_3f0 = 0;
      local_3e8 = 0;
      std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
                ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)0x1574c3);
      myvk::CommandBuffer::CmdPipelineBarrier
                (in_stack_fffffffffffff890,
                 (VkPipelineStageFlags)((ulong)in_stack_fffffffffffff888 >> 0x20),
                 (VkPipelineStageFlags)in_stack_fffffffffffff888,in_stack_fffffffffffff880,
                 (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                 in_stack_fffffffffffff878,
                 (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                 in_stack_fffffffffffff870);
      std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
                ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
                ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      std::allocator<VkBufferMemoryBarrier>::~allocator(&local_3d9);
      std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
                ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)
                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x157532);
      std::shared_ptr<myvk::PipelineBase>::shared_ptr<myvk::ComputePipeline,void>
                ((shared_ptr<myvk::PipelineBase> *)in_stack_fffffffffffff830,
                 (shared_ptr<myvk::ComputePipeline> *)
                 CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
      myvk::CommandBuffer::CmdBindPipeline
                ((CommandBuffer *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                 (Ptr<PipelineBase> *)in_stack_fffffffffffff838);
      std::shared_ptr<myvk::PipelineBase>::~shared_ptr((shared_ptr<myvk::PipelineBase> *)0x15757f);
      std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x15758c);
      std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
                ((shared_ptr<myvk::BufferBase> *)in_stack_fffffffffffff830,
                 (shared_ptr<myvk::Buffer> *)
                 CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
      myvk::CommandBuffer::CmdDispatchIndirect
                ((CommandBuffer *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                 (Ptr<BufferBase> *)in_stack_fffffffffffff838,
                 (VkDeviceSize)in_stack_fffffffffffff830);
      std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x1575da);
      std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1575e7);
      local_438 = 0;
      uStack_430 = 0;
      local_428 = 0;
      std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
                ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x157610);
      std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x157624);
      myvk::BufferBase::GetMemoryBarrier
                (in_stack_fffffffffffff850,(VkAccessFlags)((ulong)in_stack_fffffffffffff848 >> 0x20)
                 ,(VkAccessFlags)in_stack_fffffffffffff848,in_stack_fffffffffffff844,
                 in_stack_fffffffffffff840);
      local_460 = (undefined1 *)((long)&local_499.super_DeviceObjectBase.super_Base._vptr_Base + 1);
      local_458 = 1;
      in_stack_fffffffffffff890 = &local_499;
      std::allocator<VkBufferMemoryBarrier>::allocator((allocator<VkBufferMemoryBarrier> *)0x157677)
      ;
      __l_06._M_len = (size_type)in_stack_fffffffffffff870;
      __l_06._M_array = in_stack_fffffffffffff868;
      std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
                ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                 in_stack_fffffffffffff860,__l_06,(allocator_type *)in_stack_fffffffffffff858);
      local_4c8.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uStack_4b0 = 0;
      local_4a8 = 0;
      in_stack_fffffffffffff888 =
           &local_4c8.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
      std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
                ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)0x1576c4);
      myvk::CommandBuffer::CmdPipelineBarrier
                (in_stack_fffffffffffff890,
                 (VkPipelineStageFlags)((ulong)in_stack_fffffffffffff888 >> 0x20),
                 (VkPipelineStageFlags)in_stack_fffffffffffff888,in_stack_fffffffffffff880,
                 (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                 in_stack_fffffffffffff878,
                 (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                 in_stack_fffffffffffff870);
      std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
                ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
                ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      std::allocator<VkBufferMemoryBarrier>::~allocator
                ((allocator<VkBufferMemoryBarrier> *)&local_499);
      std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
                ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)
                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      in_stack_fffffffffffff878 =
           std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x15772d);
      in_stack_fffffffffffff880 = &local_4c8;
      std::shared_ptr<myvk::PipelineBase>::shared_ptr<myvk::ComputePipeline,void>
                ((shared_ptr<myvk::PipelineBase> *)in_stack_fffffffffffff830,
                 (shared_ptr<myvk::ComputePipeline> *)
                 CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
      myvk::CommandBuffer::CmdBindPipeline
                ((CommandBuffer *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                 (Ptr<PipelineBase> *)in_stack_fffffffffffff838);
      std::shared_ptr<myvk::PipelineBase>::~shared_ptr((shared_ptr<myvk::PipelineBase> *)0x15776e);
      std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x15777b);
      myvk::CommandBuffer::CmdDispatch
                (in_stack_fffffffffffff830,in_stack_fffffffffffff82c,in_stack_fffffffffffff828,0);
      in_stack_fffffffffffff870 =
           std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x157799);
      local_4e8 = 0;
      uStack_4e0 = 0;
      local_4d8 = 0;
      std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
                ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x1577c2);
      std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1577d6);
      myvk::BufferBase::GetMemoryBarrier
                (in_stack_fffffffffffff850,(VkAccessFlags)((ulong)in_stack_fffffffffffff848 >> 0x20)
                 ,(VkAccessFlags)in_stack_fffffffffffff848,in_stack_fffffffffffff844,
                 in_stack_fffffffffffff840);
      local_510 = (byte *)((long)&local_549.sType + 1);
      local_508 = 1;
      in_stack_fffffffffffff868 = (iterator)(local_568 + 0x1f);
      std::allocator<VkBufferMemoryBarrier>::allocator((allocator<VkBufferMemoryBarrier> *)0x157829)
      ;
      __l_07._M_len = (size_type)in_stack_fffffffffffff870;
      __l_07._M_array = in_stack_fffffffffffff868;
      std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
                ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                 in_stack_fffffffffffff860,__l_07,(allocator_type *)in_stack_fffffffffffff858);
      local_568._0_8_ = (_func_int **)0x0;
      local_568._8_8_ = (element_type *)0x0;
      local_568._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      in_stack_fffffffffffff860 = (CommandBuffer *)local_568;
      std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
                ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)0x157876);
      myvk::CommandBuffer::CmdPipelineBarrier
                (in_stack_fffffffffffff890,
                 (VkPipelineStageFlags)((ulong)in_stack_fffffffffffff888 >> 0x20),
                 (VkPipelineStageFlags)in_stack_fffffffffffff888,in_stack_fffffffffffff880,
                 (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                 in_stack_fffffffffffff878,
                 (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                 in_stack_fffffffffffff870);
      std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
                ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
                ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      std::allocator<VkBufferMemoryBarrier>::~allocator
                ((allocator<VkBufferMemoryBarrier> *)(local_568 + 0x1f));
      std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
                ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)
                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      in_stack_fffffffffffff858 =
           std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1578e2);
      local_588 = 0;
      uStack_580 = 0;
      local_578 = 0;
      std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
                ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x15790b);
      std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x15791f);
      myvk::BufferBase::GetMemoryBarrier
                (in_stack_fffffffffffff850,(VkAccessFlags)((ulong)in_stack_fffffffffffff848 >> 0x20)
                 ,(VkAccessFlags)in_stack_fffffffffffff848,in_stack_fffffffffffff844,
                 in_stack_fffffffffffff840);
      local_5b0 = (undefined1 *)((long)&local_5e9.super_DeviceObjectBase.super_Base._vptr_Base + 1);
      local_5a8 = 1;
      in_stack_fffffffffffff850 = &local_5e9;
      std::allocator<VkBufferMemoryBarrier>::allocator((allocator<VkBufferMemoryBarrier> *)0x157972)
      ;
      __l_08._M_len = (size_type)in_stack_fffffffffffff870;
      __l_08._M_array = in_stack_fffffffffffff868;
      std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
                ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                 in_stack_fffffffffffff860,__l_08,(allocator_type *)in_stack_fffffffffffff858);
      local_608.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_608.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_608.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      in_stack_fffffffffffff848 = &local_608;
      std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
                ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)0x1579bf);
      myvk::CommandBuffer::CmdPipelineBarrier
                (in_stack_fffffffffffff890,
                 (VkPipelineStageFlags)((ulong)in_stack_fffffffffffff888 >> 0x20),
                 (VkPipelineStageFlags)in_stack_fffffffffffff888,in_stack_fffffffffffff880,
                 (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                 in_stack_fffffffffffff878,
                 (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                 in_stack_fffffffffffff870);
      std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
                ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
                ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      std::allocator<VkBufferMemoryBarrier>::~allocator
                ((allocator<VkBufferMemoryBarrier> *)&local_5e9);
      std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
                ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)
                 CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
    }
    local_28c = local_28c + 1;
  }
  return;
}

Assistant:

void OctreeBuilder::CmdBuild(const std::shared_ptr<myvk::CommandBuffer> &command_buffer) const {
	// transfers
	{
		command_buffer->CmdCopy(m_build_info_staging_buffer, m_build_info_buffer,
		                        {{0, 0, m_build_info_buffer->GetSize()}});
		command_buffer->CmdCopy(m_indirect_staging_buffer, m_indirect_buffer, {{0, 0, m_indirect_buffer->GetSize()}});

		command_buffer->CmdPipelineBarrier(
		    VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, {},
		    {m_build_info_buffer->GetMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT,
		                                           VK_ACCESS_SHADER_READ_BIT | VK_ACCESS_SHADER_WRITE_BIT)},
		    {});

		command_buffer->CmdPipelineBarrier(
		    VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_DRAW_INDIRECT_BIT | VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT,
		    {},
		    {m_indirect_buffer->GetMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT,
		                                         VK_ACCESS_INDIRECT_COMMAND_READ_BIT | VK_ACCESS_SHADER_WRITE_BIT)},
		    {});
	}

	uint32_t fragment_group_x = group_x_64(m_voxelizer_ptr->GetVoxelFragmentCount());

	command_buffer->CmdBindDescriptorSets({m_descriptor_set}, m_pipeline_layout, VK_PIPELINE_BIND_POINT_COMPUTE, {});

	for (uint32_t i = 1; i <= m_voxelizer_ptr->GetLevel(); ++i) {
		command_buffer->CmdBindPipeline(m_init_node_pipeline);
		command_buffer->CmdDispatchIndirect(m_indirect_buffer);

		command_buffer->CmdPipelineBarrier(
		    VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, {},
		    {m_octree_buffer->GetMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT,
		                                       VK_ACCESS_SHADER_READ_BIT | VK_ACCESS_SHADER_WRITE_BIT)},
		    {});

		command_buffer->CmdBindPipeline(m_tag_node_pipeline);
		command_buffer->CmdDispatch(fragment_group_x, 1, 1);

		if (i != m_voxelizer_ptr->GetLevel()) {
			command_buffer->CmdPipelineBarrier(
			    VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, {},
			    {m_octree_buffer->GetMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT,
			                                       VK_ACCESS_SHADER_READ_BIT | VK_ACCESS_SHADER_WRITE_BIT)},
			    {});

			command_buffer->CmdBindPipeline(m_alloc_node_pipeline);
			command_buffer->CmdDispatchIndirect(m_indirect_buffer);

			command_buffer->CmdPipelineBarrier(
			    VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, {},
			    {m_octree_buffer->GetMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT,
			                                       VK_ACCESS_SHADER_READ_BIT | VK_ACCESS_SHADER_WRITE_BIT)},
			    {});

			command_buffer->CmdBindPipeline(m_modify_arg_pipeline);
			command_buffer->CmdDispatch(1, 1, 1);

			command_buffer->CmdPipelineBarrier(
			    VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT,
			    VK_PIPELINE_STAGE_DRAW_INDIRECT_BIT | VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, {},
			    {m_indirect_buffer->GetMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT,
			                                         VK_ACCESS_INDIRECT_COMMAND_READ_BIT | VK_ACCESS_SHADER_WRITE_BIT)},
			    {});
			command_buffer->CmdPipelineBarrier(
			    VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, {},
			    {m_build_info_buffer->GetMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT)}, {});
		}
	}
}